

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O2

void tcc_add_bcheck(TCCState *s1)

{
  int symbol;
  undefined8 *puVar1;
  Section *sec;
  undefined4 *puVar2;
  
  if (s1->do_bounds_check != 0) {
    puVar1 = (undefined8 *)section_ptr_add(bounds_section,8);
    *puVar1 = 0;
    set_elf_sym(symtab_section,0,0,0x10,0,bounds_section->sh_num,"__bounds_start");
    symbol = set_elf_sym(symtab_section,0,0,0x10,0,0,"__bound_init");
    if (s1->output_type != 1) {
      sec = find_section(s1,".init");
      puVar2 = (undefined4 *)section_ptr_add(sec,5);
      *puVar2 = 0xfffffce8;
      *(undefined1 *)(puVar2 + 1) = 0xff;
      put_elf_reloc(symtab_section,sec,sec->data_offset - 4,2,symbol);
      return;
    }
  }
  return;
}

Assistant:

ST_FUNC void tcc_add_bcheck(TCCState* s1) {
#ifdef CONFIG_TCC_BCHECK
  addr_t* ptr;
  int sym_index;

  if (0 == s1->do_bounds_check)
    return;
  /* XXX: add an object file to do that */
  ptr = section_ptr_add(bounds_section, sizeof(*ptr));
  *ptr = 0;
  set_elf_sym(symtab_section, 0, 0, ELFW(ST_INFO)(STB_GLOBAL, STT_NOTYPE), 0, bounds_section->sh_num, "__bounds_start");
  /* pull bcheck.o from libtcc1.a */
  sym_index = set_elf_sym(symtab_section, 0, 0, ELFW(ST_INFO)(STB_GLOBAL, STT_NOTYPE), 0, SHN_UNDEF, "__bound_init");
  if (s1->output_type != TCC_OUTPUT_MEMORY) {
    /* add 'call __bound_init()' in .init section */
    Section* init_section = find_section(s1, ".init");
    unsigned char* pinit = section_ptr_add(init_section, 5);
    pinit[0] = 0xe8;
    write32le(pinit + 1, -4);
    put_elf_reloc(symtab_section, init_section, init_section->data_offset - 4, R_386_PC32, sym_index);
    /* R_386_PC32 = R_X86_64_PC32 = 2 */
  }
#endif
}